

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixWrite(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  uint uVar1;
  int iVar2;
  __off_t _Var3;
  ssize_t sVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  
  iVar7 = -2;
  while( true ) {
    if (amt < 1) {
      return 0;
    }
    _Var3 = lseek(*(int *)&id[2].pMethods,offset,0);
    if (_Var3 != offset) break;
    sVar4 = write(*(int *)&id[2].pMethods,pBuf,amt);
    uVar1 = (uint)sVar4;
    if ((int)uVar1 < 0) goto LAB_0010efbf;
    if (uVar1 == 0) {
      iVar2 = 0;
      iVar7 = -0x49;
      goto LAB_0010efcd;
    }
    uVar5 = (ulong)(uVar1 & 0x7fffffff);
    amt = amt - uVar5;
    offset = offset + uVar5;
    pBuf = (void *)((long)pBuf + uVar5);
  }
  if (_Var3 != -1) {
    iVar2 = 0;
    goto LAB_0010efcd;
  }
LAB_0010efbf:
  piVar6 = __errno_location();
  iVar2 = *piVar6;
LAB_0010efcd:
  *(int *)((long)&id[3].pMethods + 4) = iVar2;
  return iVar7;
}

Assistant:

static int unixWrite(
  unqlite_file *id, 
  const void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  
  if( amt>0 ){
    if( wrote<0 ){
      /* lastErrno set by seekAndWrite */
      return UNQLITE_IOERR;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return UNQLITE_FULL;
    }
  }
  return UNQLITE_OK;
}